

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

xmlSchemaTypePtr xmlSchemaGetBuiltInListSimpleTypeItemType(xmlSchemaTypePtr type)

{
  int iVar1;
  
  if ((type != (xmlSchemaTypePtr)0x0) && (type->type == XML_SCHEMA_TYPE_BASIC)) {
    iVar1 = type->builtInType;
    if (iVar1 == 0x1b) {
      return xmlSchemaTypeEntityDef;
    }
    if (iVar1 == 0x19) {
      return xmlSchemaTypeIdrefDef;
    }
    if (iVar1 == 0x13) {
      return xmlSchemaTypeNmtokenDef;
    }
  }
  return (xmlSchemaTypePtr)0x0;
}

Assistant:

xmlSchemaTypePtr
xmlSchemaGetBuiltInListSimpleTypeItemType(xmlSchemaTypePtr type)
{
    if ((type == NULL) || (type->type != XML_SCHEMA_TYPE_BASIC))
	return (NULL);
    switch (type->builtInType) {
	case XML_SCHEMAS_NMTOKENS:
	    return (xmlSchemaTypeNmtokenDef );
	case XML_SCHEMAS_IDREFS:
	    return (xmlSchemaTypeIdrefDef);
	case XML_SCHEMAS_ENTITIES:
	    return (xmlSchemaTypeEntityDef);
	default:
	    return (NULL);
    }
}